

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

QRgbaFloat32 *
qt_fetch_linear_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  int v;
  QRgbaFloat32 *pQVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Type TVar8;
  
  dVar7 = (op->field_16).linear.l;
  dVar6 = 0.0;
  dVar3 = 0.0;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar6 = (double)y + 0.5;
    dVar2 = (double)x + 0.5;
    dVar4 = data->dx + dVar6 * data->m21 + dVar2 * data->m11;
    dVar5 = data->dy + dVar6 * data->m22 + dVar2 * data->m12;
    dVar7 = data->m13;
    dVar3 = data->m23;
    if ((dVar7 != 0.0) || (((NAN(dVar7) || (dVar3 != 0.0)) || (NAN(dVar3))))) {
      dVar7 = dVar3 * dVar6 + dVar2 * dVar7 + data->m33;
      for (pQVar1 = buffer; pQVar1 < buffer + length; pQVar1 = pQVar1 + 1) {
        TVar8 = GradientBaseFP::fetchSingle
                          (&(data->field_23).gradient,
                           (dVar4 / dVar7) * (op->field_16).linear.dx +
                           (dVar5 / dVar7) * (op->field_16).linear.dy + (op->field_16).linear.off);
        pQVar1->r = TVar8.r;
        pQVar1->g = TVar8.g;
        pQVar1->b = TVar8.b;
        pQVar1->a = TVar8.a;
        dVar4 = dVar4 + data->m11;
        dVar5 = dVar5 + data->m12;
        dVar7 = dVar7 + data->m13;
        dVar7 = (double)((ulong)dVar7 & -(ulong)(dVar7 != 0.0) |
                        ~-(ulong)(dVar7 != 0.0) & (ulong)(data->m13 + dVar7));
      }
      return buffer;
    }
    dVar7 = (op->field_16).linear.dx;
    dVar6 = (op->field_16).linear.dy;
    dVar3 = (dVar5 * dVar6 + dVar7 * dVar4 + (op->field_16).linear.off) * 1023.0;
    dVar6 = (data->m12 * dVar6 + dVar7 * data->m11) * 1023.0;
  }
  if (1e-05 <= ABS(dVar6)) {
    if (((4194303.0 <= ABS(dVar6)) || (4194303.0 <= ABS(dVar3))) ||
       (4194303.0 <= ABS((double)length * dVar6 + dVar3))) {
      for (pQVar1 = buffer; pQVar1 < buffer + length; pQVar1 = pQVar1 + 1) {
        TVar8 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar3 * 0.0009765625);
        pQVar1->r = TVar8.r;
        pQVar1->g = TVar8.g;
        pQVar1->b = TVar8.b;
        pQVar1->a = TVar8.a;
        dVar3 = dVar3 + dVar6;
      }
    }
    else {
      v = (int)(dVar3 * 256.0);
      for (pQVar1 = buffer; pQVar1 < buffer + length; pQVar1 = pQVar1 + 1) {
        TVar8 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,v);
        pQVar1->r = TVar8.r;
        pQVar1->g = TVar8.g;
        pQVar1->b = TVar8.b;
        pQVar1->a = TVar8.a;
        v = v + (int)(dVar6 * 256.0);
      }
    }
  }
  else {
    if (4194303.0 <= ABS(dVar3)) {
      TVar8 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar3 * 0.0009765625);
    }
    else {
      TVar8 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,(int)(dVar3 * 256.0));
    }
    (*qt_memfill64)((quint64 *)buffer,TVar8._0_8_,(long)length);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_linear_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_linear_gradient_template<GradientBaseFP, QRgbaFloat32>(buffer, op, data, y, x, length);
}